

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  char *pcVar1;
  byte *pbVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  byte *pbVar6;
  Location pCVar7;
  long lVar8;
  uint uVar9;
  
  pbVar2 = (byte *)this->end_;
  pbVar6 = (byte *)this->current_;
  while (((pbVar6 != pbVar2 && ((ulong)*pbVar6 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
    this->current_ = (Location)pbVar6;
  }
  pbVar6 = (byte *)this->current_;
  token->start_ = (Location)pbVar6;
  if (pbVar6 == pbVar2) {
    bVar5 = 0;
  }
  else {
    this->current_ = (Location)(pbVar6 + 1);
    bVar5 = *pbVar6;
  }
  if (0x5a < bVar5) {
    if (bVar5 < 0x6e) {
      if (bVar5 == 0x5b) {
        token->type_ = tokenArrayBegin;
        goto LAB_00145ea2;
      }
      if (bVar5 == 0x5d) {
        token->type_ = tokenArrayEnd;
        goto LAB_00145ea2;
      }
      if (bVar5 == 0x66) {
        token->type_ = tokenFalse;
        pCVar7 = this->current_;
        if (3 < (long)pbVar2 - (long)pCVar7) {
          lVar8 = 3;
          do {
            if (lVar8 == -1) {
              pCVar7 = pCVar7 + 4;
              goto LAB_00145ed9;
            }
            pcVar1 = pCVar7 + lVar8;
            lVar3 = lVar8 + 1;
            lVar8 = lVar8 + -1;
          } while (*pcVar1 == "false"[lVar3]);
        }
      }
    }
    else if (bVar5 < 0x7b) {
      if (bVar5 == 0x6e) {
        token->type_ = tokenNull;
        pCVar7 = this->current_;
        if (2 < (long)pbVar2 - (long)pCVar7) {
          lVar8 = 2;
          do {
            if (lVar8 == -1) goto LAB_00145ecf;
            pcVar1 = pCVar7 + lVar8;
            lVar3 = lVar8 + 1;
            lVar8 = lVar8 + -1;
          } while (*pcVar1 == "null"[lVar3]);
        }
      }
      else if (bVar5 == 0x74) {
        token->type_ = tokenTrue;
        pCVar7 = this->current_;
        if (2 < (long)pbVar2 - (long)pCVar7) {
          lVar8 = 2;
          do {
            if (lVar8 == -1) goto LAB_00145ecf;
            pcVar1 = pCVar7 + lVar8;
            lVar3 = lVar8 + 1;
            lVar8 = lVar8 + -1;
          } while (*pcVar1 == "true"[lVar3]);
        }
      }
    }
    else {
      if (bVar5 == 0x7d) {
        token->type_ = tokenObjectEnd;
        goto LAB_00145ea2;
      }
      if (bVar5 == 0x7b) {
        token->type_ = tokenObjectBegin;
        goto LAB_00145ea2;
      }
    }
    goto switchD_00145cea_caseD_23;
  }
  switch(bVar5) {
  case 0x22:
    token->type_ = tokenString;
    bVar4 = readString(this);
    goto LAB_00145e4d;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    break;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    goto LAB_00145ea2;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    pbVar6 = (byte *)this->current_;
    while ((pbVar6 != pbVar2 &&
           (((byte)(*pbVar6 - 0x30) < 10 ||
            ((uVar9 = *pbVar6 - 0x2b, uVar9 < 0x3b &&
             ((0x40000000400000dU >> ((ulong)uVar9 & 0x3f) & 1) != 0))))))) {
      pbVar6 = pbVar6 + 1;
      this->current_ = (Location)pbVar6;
    }
    goto LAB_00145ea2;
  case 0x2f:
    token->type_ = tokenComment;
    bVar4 = readComment(this);
LAB_00145e4d:
    if (bVar4 != false) goto LAB_00145ea2;
    break;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
    goto LAB_00145ea2;
  default:
    if (bVar5 == 0) {
      token->type_ = tokenEndOfStream;
      goto LAB_00145ea2;
    }
  }
switchD_00145cea_caseD_23:
  token->type_ = tokenError;
LAB_00145ea2:
  token->end_ = this->current_;
  return true;
LAB_00145ecf:
  pCVar7 = pCVar7 + 3;
LAB_00145ed9:
  this->current_ = pCVar7;
  goto LAB_00145ea2;
}

Assistant:

bool 
Reader::readToken( Token &token )
{
   skipSpaces();
   token.start_ = current_;
   Char c = getNextChar();
   bool ok = true;
   switch ( c )
   {
   case '{':
      token.type_ = tokenObjectBegin;
      break;
   case '}':
      token.type_ = tokenObjectEnd;
      break;
   case '[':
      token.type_ = tokenArrayBegin;
      break;
   case ']':
      token.type_ = tokenArrayEnd;
      break;
   case '"':
      token.type_ = tokenString;
      ok = readString();
      break;
   case '/':
      token.type_ = tokenComment;
      ok = readComment();
      break;
   case '0':
   case '1':
   case '2':
   case '3':
   case '4':
   case '5':
   case '6':
   case '7':
   case '8':
   case '9':
   case '-':
      token.type_ = tokenNumber;
      readNumber();
      break;
   case 't':
      token.type_ = tokenTrue;
      ok = match( "rue", 3 );
      break;
   case 'f':
      token.type_ = tokenFalse;
      ok = match( "alse", 4 );
      break;
   case 'n':
      token.type_ = tokenNull;
      ok = match( "ull", 3 );
      break;
   case ',':
      token.type_ = tokenArraySeparator;
      break;
   case ':':
      token.type_ = tokenMemberSeparator;
      break;
   case 0:
      token.type_ = tokenEndOfStream;
      break;
   default:
      ok = false;
      break;
   }
   if ( !ok )
      token.type_ = tokenError;
   token.end_ = current_;
   return true;
}